

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::snedecor_f_dist<float>::pdf(snedecor_f_dist<float> *this,result_type_conflict1 x)

{
  int iVar1;
  int extraout_EAX;
  char *in_RCX;
  int extraout_EDX;
  void *in_RSI;
  param_type *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  result_type_conflict1 m;
  result_type_conflict1 n;
  
  iVar1 = param_type::n(in_RDI);
  fVar2 = (float)iVar1;
  param_type::m(in_RDI,in_RSI,extraout_EDX,in_RCX,in_R8D,in_R9D);
  fVar3 = math::ln(0.0);
  fVar4 = math::ln(0.0);
  fVar5 = math::ln(0.0);
  fVar6 = math::ln_Gamma(0.0);
  fVar7 = math::ln_Gamma(0.0);
  fVar8 = math::ln_Gamma(0.0);
  dVar9 = std::exp((double)(ulong)(uint)((((-fVar5 * (fVar2 * 0.5 + (float)extraout_EAX * 0.5) +
                                           fVar3 * 0.5 * fVar2 + fVar4 * (fVar2 * 0.5 + -1.0)) -
                                          fVar6) - fVar7) + fVar8));
  return SUB84(dVar9,0);
}

Assistant:

pdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      // return math::exp(math::ln(n)*result_type(1)/result_type(2)*n +
      // math::ln(m)*result_type(1)/result_type(2)*m -
      // 		       math::ln(m+n*x)*result_type(1)/result_type(2)*(m+n) +
      // 		       math::ln(x)*(result_type(1)/result_type(2)*n-1))/math::Beta(result_type(1)/result_type(2)*n,
      // result_type(1)/result_type(2)*m);
      return math::exp(result_type(1) / result_type(2) * math::ln(n / m) * n +
                       math::ln(x) * (result_type(1) / result_type(2) * n - 1) -
                       math::ln(1 + n * x / m) * (result_type(1) / result_type(2) * n +
                                                  result_type(1) / result_type(2) * m) -
                       math::ln_Gamma(result_type(1) / result_type(2) * n) -
                       math::ln_Gamma(result_type(1) / result_type(2) * m) +
                       math::ln_Gamma(result_type(1) / result_type(2) * (n + m)));
    }